

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

void __thiscall kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,SwitchStmt *stmt)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  _Rb_tree_header *p_Var3;
  Var *var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  pointer psVar6;
  pointer psVar7;
  __node_base_ptr p_Var8;
  _Hash_node_base *p_Var9;
  element_type *peVar10;
  undefined8 uVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  pointer psVar12;
  ostream *poVar13;
  _Rb_tree_node_base *p_Var14;
  ulong uVar15;
  _Base_ptr p_Var16;
  mapped_type *pmVar17;
  __node_base_ptr p_Var18;
  VarException *this_01;
  _Base_ptr p_Var19;
  long lVar20;
  char *pcVar21;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  __node_base_ptr p_Var22;
  element_type *peVar23;
  __normal_iterator<std::shared_ptr<kratos::Const>_*,_std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>_>
  __i;
  long lVar24;
  key_type *pkVar25;
  undefined1 auVar26 [8];
  bool bVar27;
  bool bVar28;
  string_view sVar29;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  SwitchStmt *local_118;
  element_type *local_110;
  string local_108;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_e8;
  key_type *local_c8;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *local_c0;
  SwitchStmt *local_b8;
  Stream *local_b0;
  undefined1 auStack_a8 [8];
  vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_> conds;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string local_60;
  allocator_type local_39;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_b0 = &this->stream_;
  puVar1 = &(this->stream_).super_stringstream.field_0x10;
  sVar29 = indent(this);
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)puVar1,sVar29._M_str,sVar29._M_len);
  pcVar21 = "";
  bVar27 = (this->options_).unique_case != false;
  if (bVar27) {
    pcVar21 = "unique";
  }
  lVar20 = 6;
  if (!bVar27) {
    lVar20 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar21,lVar20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," case (",7);
  var = (stmt->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (stmt->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  Stream::var_str_abi_cxx11_(&local_60,local_b0,var);
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,")",1);
  puVar2 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar2 = *(long *)puVar2 + 1;
  local_108._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_108,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  this->indent_ = this->indent_ + 1;
  auStack_a8 = (undefined1  [8])0x0;
  conds.
  super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  conds.
  super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>::
  reserve((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
           *)auStack_a8,(stmt->body_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var14 = (stmt->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(stmt->body_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var14 != p_Var3) {
    do {
      if (*(long *)(p_Var14 + 1) != 0) {
        std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>::
        emplace_back<std::shared_ptr<kratos::Const>const&>
                  ((vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>
                    *)auStack_a8,(shared_ptr<kratos::Const> *)(p_Var14 + 1));
      }
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while ((_Rb_tree_header *)p_Var14 != p_Var3);
  }
  psVar12 = conds.
            super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar26 = auStack_a8;
  local_b8 = stmt;
  if (auStack_a8 !=
      (undefined1  [8])
      conds.
      super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar24 = (long)conds.
                   super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8;
    uVar15 = lVar24 >> 4;
    lVar20 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar20 == 0; lVar20 = lVar20 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::SwitchStmt*)::__0>>
              (auStack_a8,
               conds.
               super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
               ._M_impl.super__Vector_impl_data._M_start,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar24 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::SwitchStmt*)::__0>>
                (auVar26,psVar12);
    }
    else {
      pkVar25 = (key_type *)((long)auVar26 + 0x100);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::SwitchStmt*)::__0>>
                (auVar26,pkVar25);
      for (; pkVar25 != psVar12; pkVar25 = pkVar25 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,__gnu_cxx::__ops::_Val_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::SwitchStmt*)::__0>>
                  (pkVar25);
      }
    }
  }
  local_60._M_dataplus._M_p = (pointer)0x0;
  if (conds.
      super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      conds.
      super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>::
    _M_realloc_insert<decltype(nullptr)>
              ((vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>
                *)auStack_a8,
               (iterator)
               conds.
               super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(void **)&local_60);
  }
  else {
    ((conds.
      super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
    ((conds.
      super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    conds.
    super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         conds.
         super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
         ._M_impl.super__Vector_impl_data._M_start + 1;
  }
  local_c8 = conds.
             super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (auStack_a8 !=
      (undefined1  [8])
      conds.
      super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_c0 = &local_b8->body_;
    auVar26 = auStack_a8;
    do {
      p_Var19 = (local_b8->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var16 = &p_Var3->_M_header;
      if (p_Var19 != (_Base_ptr)0x0) {
        do {
          bVar27 = *(element_type **)(p_Var19 + 1) <
                   (((key_type *)auVar26)->
                   super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if (!bVar27) {
            p_Var16 = p_Var19;
          }
          p_Var19 = (&p_Var19->_M_left)[bVar27];
        } while (p_Var19 != (_Base_ptr)0x0);
      }
      p_Var19 = &p_Var3->_M_header;
      if (((_Rb_tree_header *)p_Var16 != p_Var3) &&
         (p_Var19 = p_Var16,
         (((key_type *)auVar26)->super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr < *(element_type **)(p_Var16 + 1))) {
        p_Var19 = &p_Var3->_M_header;
      }
      if ((_Rb_tree_header *)p_Var19 == p_Var3) {
        local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        peVar23 = (element_type *)0x0;
      }
      else {
        pmVar17 = std::
                  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                  ::at(local_c0,(key_type *)auVar26);
        peVar23 = (pmVar17->super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr;
        local_38 = (pmVar17->super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                   )._M_refcount._M_pi;
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_38->_M_use_count = local_38->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_38->_M_use_count = local_38->_M_use_count + 1;
          }
        }
      }
      sVar29 = indent(this);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)puVar1,sVar29._M_str,sVar29._M_len);
      peVar5 = (((key_type *)auVar26)->super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      if (peVar5 == (element_type *)0x0) {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"default","");
      }
      else {
        local_68 = (((key_type *)auVar26)->
                   super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
        if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_68->_M_use_count = local_68->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_68->_M_use_count = local_68->_M_use_count + 1;
          }
        }
        Stream::var_str_abi_cxx11_(&local_60,local_b0,&peVar5->super_Var);
      }
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,local_60._M_dataplus._M_p,local_60._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,": ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 &&
          peVar5 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
      }
      if (peVar23 == (element_type *)0x0) {
LAB_0019d210:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"begin end",9);
        puVar2 = &(this->stream_).super_stringstream.field_0x90;
        *(long *)puVar2 = *(long *)puVar2 + 1;
        local_60._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,(char *)&local_60,1);
      }
      else {
        if (((peVar23->super_StmtBlock).stmts_.
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (peVar23->super_StmtBlock).stmts_.
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           ((((key_type *)auVar26)->super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr != (element_type *)0x0)) {
          this_01 = (VarException *)__cxa_allocate_exception(0x10);
          peVar5 = (((key_type *)auVar26)->
                   super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          p_Var4 = (((key_type *)auVar26)->
                   super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            }
          }
          Stream::var_str_abi_cxx11_(&local_108,local_b0,&peVar5->super_Var);
          local_e8.
          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT71(local_108._M_dataplus._M_p._1_7_,local_108._M_dataplus._M_p._0_1_);
          local_e8.
          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_108._M_string_length;
          format_str.size_ = 0xd;
          format_str.data_ = (char *)0x28;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_e8;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_60,(detail *)"Switch statement condition {0} is empty!",format_str,args)
          ;
          local_118 = local_b8;
          local_110 = (((key_type *)auVar26)->
                      super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          __l._M_len = 2;
          __l._M_array = (iterator)&local_118;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    (&local_e8,__l,&local_39);
          VarException::VarException(this_01,&local_60,&local_e8);
          __cxa_throw(this_01,&VarException::typeinfo,std::runtime_error::~runtime_error);
        }
        if (peVar23 == (element_type *)0x0) goto LAB_0019d210;
        psVar6 = (peVar23->super_StmtBlock).stmts_.
                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar7 = (peVar23->super_StmtBlock).stmts_.
                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((psVar6 == psVar7) &&
           ((((key_type *)auVar26)->super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr == (element_type *)0x0)) goto LAB_0019d210;
        bVar27 = true;
        if ((long)psVar7 - (long)psVar6 == 0x10) {
          in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                   )(this->label_index_)._M_h._M_bucket_count;
          p_Var8 = (this->label_index_)._M_h._M_buckets[(ulong)peVar23 % (ulong)in_R9.values_];
          p_Var18 = (__node_base_ptr)0x0;
          if ((p_Var8 != (__node_base_ptr)0x0) &&
             (p_Var18 = p_Var8, p_Var22 = p_Var8->_M_nxt,
             peVar23 != (element_type *)p_Var8->_M_nxt[1]._M_nxt)) {
            while (p_Var9 = p_Var22->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
              p_Var18 = (__node_base_ptr)0x0;
              if (((ulong)p_Var9[1]._M_nxt % (ulong)in_R9.values_ !=
                   (ulong)peVar23 % (ulong)in_R9.values_) ||
                 (p_Var18 = p_Var22, p_Var22 = p_Var9, peVar23 == (element_type *)p_Var9[1]._M_nxt))
              goto LAB_0019d249;
            }
            p_Var18 = (__node_base_ptr)0x0;
          }
LAB_0019d249:
          if ((p_Var18 != (__node_base_ptr)0x0) && (p_Var18->_M_nxt != (_Hash_node_base *)0x0))
          goto LAB_0019d254;
          peVar10 = (psVar6->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_78 = (psVar6->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
          if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_78->_M_use_count = local_78->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_78->_M_use_count = local_78->_M_use_count + 1;
            }
          }
          bVar28 = peVar10->type_ == Assign;
          bVar27 = false;
        }
        else {
LAB_0019d254:
          bVar28 = false;
        }
        if ((!bVar27) && (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
        }
        if (bVar28) {
          this->skip_indent_ = true;
          psVar6 = (peVar23->super_StmtBlock).stmts_.
                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = (psVar6->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          this_00._M_pi =
               (psVar6->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
          if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
            }
          }
          (**this->_vptr_SystemVerilogCodeGen)(this,uVar11);
          if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
          }
        }
        else {
          this->indent_ = this->indent_ + 1;
          (**this->_vptr_SystemVerilogCodeGen)(this,peVar23);
          this->indent_ = this->indent_ - 1;
        }
      }
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      auVar26 = (undefined1  [8])((long)auVar26 + 0x10);
    } while (auVar26 != (undefined1  [8])local_c8);
  }
  this->indent_ = this->indent_ - 1;
  sVar29 = indent(this);
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)puVar1,sVar29._M_str,sVar29._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"endcase",7);
  puVar1 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  local_60._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_60,1);
  std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
           *)auStack_a8);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(SwitchStmt* stmt) {
    stream_ << indent() << (options_.unique_case ? "unique" : "") << " case ("
            << stream_.var_str(stmt->target()) << ")" << stream_.endl();
    indent_++;
    auto const& body = stmt->body();
    std::vector<std::shared_ptr<Const>> conds;
    conds.reserve(body.size());
    for (auto const& iter : body) {
        if (iter.first) conds.emplace_back(iter.first);
    }
    std::sort(conds.begin(), conds.end(),
              [](const auto& lhs, const auto& rhs) { return lhs->value() < rhs->value(); });
    conds.emplace_back(nullptr);

    for (auto& cond : conds) {
        const auto& stmt_blk = (body.find(cond) != body.end()) ? body.at(cond) : nullptr;
        stream_ << indent() << (cond ? stream_.var_str(cond) : "default") << ": ";
        if (stmt_blk && stmt_blk->empty() && cond) {
            throw VarException(
                ::format("Switch statement condition {0} is empty!", stream_.var_str(cond)),
                {stmt, cond.get()});
        } else if (!stmt_blk || (stmt_blk->empty() && !cond)) {
            //  empty default case
            stream_ << "begin end" << stream_.endl();
        } else {
            // directly output the code if the block only has 1 element
            if (stmt_blk->size() == 1 && label_index_.find(stmt_blk.get()) == label_index_.end() &&
                stmt_blk->get_stmt(0)->type() == StatementType::Assign) {
                skip_indent_ = true;
                dispatch_node((*stmt_blk)[0].get());
            } else {
                indent_++;
                dispatch_node(stmt_blk.get());
                indent_--;
            }
        }
    }

    indent_--;
    stream_ << indent() << "endcase" << stream_.endl();
}